

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::FindMakeProgram(cmGlobalGenerator *this,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  long lVar6;
  string dir;
  string file;
  string saveFile;
  string makeProgram;
  string local_268;
  string local_248;
  long *local_228 [2];
  long local_218 [2];
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if ((this->FindMakeProgramFile)._M_string_length == 0) {
    cmSystemTools::Error
              ("Generator implementation error, all generators must specify this->FindMakeProgramFile"
               ,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  pcVar2 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_MAKE_PROGRAM","");
  pcVar4 = cmMakefile::GetDefinition(mf,(string *)local_1a8);
  if (pcVar4 == (char *)0x0) {
    bVar3 = true;
  }
  else {
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"CMAKE_MAKE_PROGRAM","");
    pcVar4 = cmMakefile::GetDefinition(mf,&local_1c8);
    bVar3 = cmSystemTools::IsOff(pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((char *)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (bVar3 != false) {
    cmMakefile::GetModulesFile_abi_cxx11_
              ((string *)local_1a8,mf,(this->FindMakeProgramFile)._M_dataplus._M_p);
    if (local_1a8._8_8_ != 0) {
      cmMakefile::ReadListFile(mf,(char *)local_1a8._0_8_);
    }
    if ((char *)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_MAKE_PROGRAM","");
  pcVar4 = cmMakefile::GetDefinition(mf,(string *)local_1a8);
  if (pcVar4 == (char *)0x0) {
    bVar3 = true;
  }
  else {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"CMAKE_MAKE_PROGRAM","");
    pcVar4 = cmMakefile::GetDefinition(mf,&local_1e8);
    bVar3 = cmSystemTools::IsOff(pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((char *)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (bVar3 == false) {
    paVar1 = &local_268.field_2;
    local_268._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"CMAKE_MAKE_PROGRAM","");
    pcVar4 = cmMakefile::GetRequiredDefinition(mf,&local_268);
    std::__cxx11::string::string((string *)local_1a8,pcVar4,(allocator *)&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                               local_268.field_2._M_local_buf[0]) + 1);
    }
    lVar6 = std::__cxx11::string::find((char)local_1a8,0x20);
    if (lVar6 != -1) {
      local_268._M_string_length = 0;
      local_268.field_2._M_local_buf[0] = '\0';
      local_248._M_string_length = 0;
      local_248.field_2._M_local_buf[0] = '\0';
      local_268._M_dataplus._M_p = (pointer)paVar1;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      cmsys::SystemTools::SplitProgramPath((string *)local_1a8,&local_268,&local_248,true);
      local_228[0] = local_218;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_228,local_248._M_dataplus._M_p,
                 local_248._M_dataplus._M_p + local_248._M_string_length);
      cmsys::SystemTools::GetShortPath((string *)local_1a8,(string *)local_1a8);
      cmsys::SystemTools::SplitProgramPath((string *)local_1a8,&local_268,&local_248,true);
      std::__cxx11::string::_M_assign((string *)local_1a8);
      std::__cxx11::string::append(local_1a8);
      std::__cxx11::string::_M_append(local_1a8,(ulong)local_228[0]);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"CMAKE_MAKE_PROGRAM","");
      cmMakefile::AddCacheDefinition
                (mf,&local_208,(char *)local_1a8._0_8_,"make program",FILEPATH,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (local_228[0] != local_218) {
        operator_delete(local_228[0],local_218[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar1) {
        operator_delete(local_268._M_dataplus._M_p,
                        CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                 local_268.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((char *)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"CMake was unable to find a build program corresponding to \"",
               0x3b);
    (*this->_vptr_cmGlobalGenerator[2])(&local_268,this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"\".  CMAKE_MAKE_PROGRAM is not set.  You ",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"probably need to select a different build tool.",0x2f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                               local_268.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(local_268._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                               local_268.field_2._M_local_buf[0]) + 1);
    }
    cmSystemTools::s_FatalErrorOccured = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void cmGlobalGenerator::FindMakeProgram(cmMakefile* mf)
{
  if(this->FindMakeProgramFile.empty())
    {
    cmSystemTools::Error(
      "Generator implementation error, "
      "all generators must specify this->FindMakeProgramFile");
    }
  if(!mf->GetDefinition("CMAKE_MAKE_PROGRAM")
     || cmSystemTools::IsOff(mf->GetDefinition("CMAKE_MAKE_PROGRAM")))
    {
    std::string setMakeProgram =
      mf->GetModulesFile(this->FindMakeProgramFile.c_str());
    if(!setMakeProgram.empty())
      {
      mf->ReadListFile(setMakeProgram.c_str());
      }
    }
  if(!mf->GetDefinition("CMAKE_MAKE_PROGRAM")
     || cmSystemTools::IsOff(mf->GetDefinition("CMAKE_MAKE_PROGRAM")))
    {
    std::ostringstream err;
    err << "CMake was unable to find a build program corresponding to \""
        << this->GetName() << "\".  CMAKE_MAKE_PROGRAM is not set.  You "
        << "probably need to select a different build tool.";
    cmSystemTools::Error(err.str().c_str());
    cmSystemTools::SetFatalErrorOccured();
    return;
    }
  std::string makeProgram = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  // if there are spaces in the make program use short path
  // but do not short path the actual program name, as
  // this can cause trouble with VSExpress
  if(makeProgram.find(' ') != makeProgram.npos)
    {
    std::string dir;
    std::string file;
    cmSystemTools::SplitProgramPath(makeProgram,
                                    dir, file);
    std::string saveFile = file;
    cmSystemTools::GetShortPath(makeProgram, makeProgram);
    cmSystemTools::SplitProgramPath(makeProgram,
                                    dir, file);
    makeProgram = dir;
    makeProgram += "/";
    makeProgram += saveFile;
    mf->AddCacheDefinition("CMAKE_MAKE_PROGRAM", makeProgram.c_str(),
                           "make program",
                           cmState::FILEPATH);
    }
}